

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O1

bool __thiscall YAML::Utils::WriteTag(Utils *this,ostream_wrapper *out,string *str,bool verbatim)

{
  RegEx *pRVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  size_t __n;
  void *__buf;
  int iVar4;
  RegEx *param;
  RegEx *pRVar5;
  long lVar6;
  char *pcVar7;
  pointer pRVar8;
  ulong uVar9;
  pointer pcVar10;
  StringCharSource buffer;
  char local_71;
  RegEx *local_70;
  StringCharSource local_68;
  int local_44;
  pointer local_40;
  pointer local_38;
  
  __n = CONCAT71(in_register_00000009,verbatim);
  iVar4 = (int)str;
  pcVar7 = "!";
  if (iVar4 != 0) {
    pcVar7 = "!<";
  }
  local_68.m_str = (char *)&local_68.m_offset;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,pcVar7,pcVar7 + ((ulong)str & 0xffffffff) + 1);
  ostream_wrapper::write((ostream_wrapper *)this,(int)&local_68,__buf,__n);
  if ((size_t *)local_68.m_str != &local_68.m_offset) {
    operator_delete(local_68.m_str);
  }
  local_68.m_str =
       (out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.m_size =
       (size_t)(out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_68.m_offset = 0;
  local_44 = iVar4;
  if ((char)str == '\0') {
    local_70 = Exp::Tag();
  }
  else {
    local_70 = Exp::URI();
  }
  do {
    pcVar10 = (pointer)local_68.m_size;
    local_38 = (pointer)local_68.m_offset;
    if (local_68.m_size <= local_68.m_offset) {
      if ((char)local_44 != '\0') {
        ostream_wrapper::write((ostream_wrapper *)this,0x75164b,(void *)0x1,local_68.m_offset);
      }
      break;
    }
    uVar2 = 0xffffffff;
    uVar3 = uVar2;
    switch(local_70->m_op) {
    case REGEX_MATCH:
      uVar3 = (uint)(local_68.m_str[local_68.m_offset] == local_70->m_a) * 2 - 1;
      break;
    case REGEX_RANGE:
      uVar3 = -(uint)(local_70->m_z < local_68.m_str[local_68.m_offset] ||
                     local_68.m_str[local_68.m_offset] < local_70->m_a);
LAB_00718597:
      uVar3 = uVar3 | 1;
      break;
    case REGEX_OR:
      pRVar5 = (local_70->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pRVar1 = (local_70->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pRVar5 != pRVar1) {
        local_40 = (pointer)local_68.m_size;
        do {
          uVar3 = RegEx::MatchUnchecked<YAML::StringCharSource>(pRVar5,&local_68);
          pcVar10 = local_40;
          if (-1 < (int)uVar3) break;
          pRVar5 = pRVar5 + 1;
          uVar3 = uVar2;
        } while (pRVar5 != pRVar1);
      }
      break;
    case REGEX_AND:
      pRVar8 = (local_70->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((local_70->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
          .super__Vector_impl_data._M_finish != pRVar8) {
        lVar6 = 0;
        uVar9 = 0;
        uVar3 = 0xffffffff;
        do {
          uVar2 = RegEx::MatchUnchecked<YAML::StringCharSource>
                            ((RegEx *)((long)&pRVar8->m_op + lVar6),&local_68);
          if (uVar2 == 0xffffffff) {
            uVar3 = 0xffffffff;
            break;
          }
          if (uVar9 == 0) {
            uVar3 = uVar2;
          }
          uVar9 = uVar9 + 1;
          pRVar8 = (local_70->m_params).
                   super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x20;
        } while (uVar9 < (ulong)((long)(local_70->m_params).
                                       super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >>
                                5));
      }
      break;
    case REGEX_NOT:
      pRVar5 = (local_70->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pRVar5 != (local_70->m_params).
                    super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        uVar3 = RegEx::MatchUnchecked<YAML::StringCharSource>(pRVar5,&local_68);
        uVar3 = (int)~uVar3 >> 0x1f;
        goto LAB_00718597;
      }
      break;
    case REGEX_SEQ:
      uVar3 = RegEx::MatchOpSeq<YAML::StringCharSource>(local_70,&local_68);
    }
    if ((int)uVar3 < 1) break;
    iVar4 = uVar3 + 1;
    do {
      local_71 = local_68.m_str[local_68.m_offset];
      ostream_wrapper::write((ostream_wrapper *)this,(int)&local_71,(void *)0x1,local_68.m_offset);
      local_68.m_offset = local_68.m_offset + 1;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  } while (0 < (int)uVar3);
  return pcVar10 <= local_38;
}

Assistant:

bool WriteTag(ostream_wrapper& out, const std::string& str, bool verbatim) {
  out << (verbatim ? "!<" : "!");
  StringCharSource buffer(str.c_str(), str.size());
  const RegEx& reValid = verbatim ? Exp::URI() : Exp::Tag();
  while (buffer) {
    int n = reValid.Match(buffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << buffer[0];
      ++buffer;
    }
  }
  if (verbatim) {
    out << ">";
  }
  return true;
}